

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

object * __thiscall
jessilib::deserialize_object
          (object *__return_storage_ptr__,jessilib *this,u8string_view in_data,string *in_format)

{
  long *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  get_parser((jessilib *)&local_30,(string *)in_data._M_str);
  (**(code **)(*local_30 + 0x18))(__return_storage_ptr__,local_30,this,in_data._M_len,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return __return_storage_ptr__;
}

Assistant:

object deserialize_object(std::u8string_view in_data, const std::string& in_format) {
	return get_parser(in_format)->deserialize(in_data);
}